

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O0

IntrinsicResult __thiscall
MiniScript::Intrinsic::Execute
          (Intrinsic *this,long id,Context *context,IntrinsicResult *partialResult)

{
  _func_IntrinsicResult_Context_ptr_IntrinsicResult *p_Var1;
  IntrinsicResult *pIVar2;
  IntrinsicResult local_38;
  Intrinsic *local_30;
  Intrinsic *item;
  IntrinsicResult *partialResult_local;
  Context *context_local;
  long id_local;
  
  item = (Intrinsic *)partialResult;
  partialResult_local = (IntrinsicResult *)context;
  context_local = (Context *)id;
  id_local = (long)this;
  local_30 = GetByID(id);
  pIVar2 = partialResult_local;
  p_Var1 = local_30->code;
  IntrinsicResult::IntrinsicResult(&local_38,partialResult);
  (*p_Var1)((Context *)this,(IntrinsicResult)pIVar2);
  IntrinsicResult::~IntrinsicResult(&local_38);
  return (IntrinsicResult)(IntrinsicResultStorage *)this;
}

Assistant:

IntrinsicResult Intrinsic::Execute(long id, Context *context, IntrinsicResult partialResult) {
		Intrinsic* item = GetByID(id);
		return item->code(context, partialResult);
	}